

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.cc
# Opt level: O2

void __thiscall io_buf::buf_write(io_buf *this,char **pointer,size_t n)

{
  char *pcVar1;
  char *pcVar2;
  
  while( true ) {
    pcVar1 = (this->space).end_array;
    pcVar2 = this->head;
    if (pcVar2 + n <= pcVar1) break;
    if (pcVar2 == (this->space)._begin) {
      v_array<char>::resize(&this->space,((long)pcVar1 - (long)pcVar2) * 2);
      pcVar1 = (this->space)._begin;
      (this->space)._end = pcVar1;
      this->head = pcVar1;
    }
    else {
      (*this->_vptr_io_buf[7])(this);
    }
  }
  *pointer = pcVar2;
  this->head = this->head + n;
  return;
}

Assistant:

void io_buf::buf_write(char*& pointer, size_t n)
{
  // return a pointer to the next n bytes to write into.
  if (head + n <= space.end_array)
  {
    pointer = head;
    head += n;
  }
  else  // Time to dump the file
  {
    if (head != space.begin())
      flush();
    else  // Array is short, so increase size.
    {
      space.resize(2 * (space.end_array - space.begin()));
      space.end() = space.begin();
      head = space.begin();
    }
    buf_write(pointer, n);
  }
}